

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlParseEndTag1(xmlParserCtxtPtr ctxt,int line)

{
  int iVar1;
  xmlParserInputPtr pxVar2;
  endElementSAXFunc p_Var3;
  int *piVar4;
  xmlChar *pxVar5;
  int *piVar6;
  xmlChar *pxVar7;
  
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  pxVar2 = ctxt->input;
  pxVar5 = pxVar2->cur;
  if ((*pxVar5 == '<') && (pxVar5[1] == '/')) {
    pxVar2->cur = pxVar5 + 2;
    pxVar2->col = pxVar2->col + 2;
    if (pxVar5[2] == '\0') {
      xmlParserInputGrow(pxVar2,0xfa);
    }
    pxVar5 = xmlParseNameAndCompare(ctxt,ctxt->name);
    if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlGROW(ctxt);
    }
    xmlSkipBlankChars(ctxt);
    pxVar2 = ctxt->input;
    pxVar7 = pxVar2->cur;
    if (*pxVar7 == '>') {
      pxVar2->col = pxVar2->col + 1;
      pxVar2->cur = pxVar7 + 1;
      if (pxVar7[1] == '\0') {
        xmlParserInputGrow(pxVar2,0xfa);
      }
    }
    else {
      xmlFatalErr(ctxt,XML_ERR_GT_REQUIRED,(char *)0x0);
    }
    if (pxVar5 != &DAT_00000001) {
      pxVar7 = (xmlChar *)"unparsable";
      if (pxVar5 != (xmlChar *)0x0) {
        pxVar7 = pxVar5;
      }
      xmlFatalErrMsgStrIntStr
                (ctxt,XML_ERR_TAG_NAME_MISMATCH,
                 "Opening and ending tag mismatch: %s line %d and %s\n",ctxt->name,0,pxVar7);
    }
    if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
        (p_Var3 = ctxt->sax->endElement, p_Var3 != (endElementSAXFunc)0x0)) &&
       (ctxt->disableSAX == 0)) {
      (*p_Var3)(ctxt->userData,ctxt->name);
    }
    iVar1 = ctxt->nameNr;
    if (0 < (long)iVar1) {
      ctxt->nameNr = iVar1 - 1U;
      if (iVar1 == 1) {
        pxVar5 = (xmlChar *)0x0;
      }
      else {
        pxVar5 = ctxt->nameTab[(long)iVar1 + -2];
      }
      ctxt->name = pxVar5;
      ctxt->nameTab[iVar1 - 1U] = (xmlChar *)0x0;
    }
    iVar1 = ctxt->spaceNr;
    if (0 < (long)iVar1) {
      ctxt->spaceNr = iVar1 - 1U;
      piVar4 = ctxt->spaceTab;
      piVar6 = piVar4 + (long)iVar1 + -2;
      if (iVar1 == 1) {
        piVar6 = piVar4;
      }
      ctxt->space = piVar6;
      piVar4[iVar1 - 1U] = -1;
    }
    return;
  }
  xmlFatalErrMsg(ctxt,XML_ERR_LTSLASH_REQUIRED,"xmlParseEndTag: \'</\' not found\n");
  return;
}

Assistant:

static void
xmlParseEndTag1(xmlParserCtxtPtr ctxt, int line) {
    const xmlChar *name;

    GROW;
    if ((RAW != '<') || (NXT(1) != '/')) {
	xmlFatalErrMsg(ctxt, XML_ERR_LTSLASH_REQUIRED,
		       "xmlParseEndTag: '</' not found\n");
	return;
    }
    SKIP(2);

    name = xmlParseNameAndCompare(ctxt,ctxt->name);

    /*
     * We should definitely be at the ending "S? '>'" part
     */
    GROW;
    SKIP_BLANKS;
    if ((!IS_BYTE_CHAR(RAW)) || (RAW != '>')) {
	xmlFatalErr(ctxt, XML_ERR_GT_REQUIRED, NULL);
    } else
	NEXT1;

    /*
     * [ WFC: Element Type Match ]
     * The Name in an element's end-tag must match the element type in the
     * start-tag.
     *
     */
    if (name != (xmlChar*)1) {
        if (name == NULL) name = BAD_CAST "unparsable";
        xmlFatalErrMsgStrIntStr(ctxt, XML_ERR_TAG_NAME_MISMATCH,
		     "Opening and ending tag mismatch: %s line %d and %s\n",
		                ctxt->name, line, name);
    }

    /*
     * SAX: End of Tag
     */
    if ((ctxt->sax != NULL) && (ctxt->sax->endElement != NULL) &&
	(!ctxt->disableSAX))
        ctxt->sax->endElement(ctxt->userData, ctxt->name);

    namePop(ctxt);
    spacePop(ctxt);
    return;
}